

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::GenerateClearBit_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int bitIndex)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string varName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string mask;
  
  GetBitFieldNameForBit_abi_cxx11_(&varName,this,bitIndex);
  std::__cxx11::string::string
            ((string *)&mask,
             *(char **)(bit_masks +
                       (long)(int)((long)((ulong)(uint)((int)this >> 0x1f) << 0x20 |
                                         (ulong)this & 0xffffffff) % 0x20) * 8),
             (allocator *)&local_d0);
  std::operator+(&local_90,&varName," = (");
  std::operator+(&local_70,&local_90,&varName);
  std::operator+(&local_50,&local_70," & ~");
  std::operator+(&local_d0,&local_50,&mask);
  std::operator+(__return_storage_ptr__,&local_d0,")");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&mask);
  std::__cxx11::string::~string((string *)&varName);
  return __return_storage_ptr__;
}

Assistant:

string GenerateClearBit(int bitIndex) {
  string varName = GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  string mask = bit_masks[bitInVarIndex];
  string result = varName + " = (" + varName + " & ~" + mask + ")";
  return result;
}